

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentationSection.cxx
# Opt level: O3

void __thiscall cmDocumentationSection::Append(cmDocumentationSection *this,char *(*data) [2])

{
  char *b;
  cmDocumentationEntry local_68;
  
  b = (*data)[1];
  if (b != (char *)0x0) {
    do {
      cmDocumentationEntry::cmDocumentationEntry(&local_68,(*data)[0],b);
      std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>::
      emplace_back<cmDocumentationEntry>(&this->Entries,&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68.Brief._M_dataplus._M_p != &local_68.Brief.field_2) {
        operator_delete(local_68.Brief._M_dataplus._M_p,
                        local_68.Brief.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68.Name._M_dataplus._M_p != &local_68.Name.field_2) {
        operator_delete(local_68.Name._M_dataplus._M_p,
                        local_68.Name.field_2._M_allocated_capacity + 1);
      }
      b = data[1][1];
      data = data + 1;
    } while (b != (char *)0x0);
  }
  return;
}

Assistant:

void cmDocumentationSection::Append(const char* data[][2])
{
  int i = 0;
  while (data[i][1]) {
    this->Entries.push_back(cmDocumentationEntry(data[i][0], data[i][1]));
    data += 1;
  }
}